

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_scalar_umul128(uint16_t *in,uint32_t n,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  ushort *puVar5;
  int *in_RDX;
  uint in_ESI;
  ushort *in_RDI;
  int i;
  uint16_t x;
  uint16_t *tail_end;
  uint64_t hi_c;
  uint64_t hi_b;
  uint64_t hi_a;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t v;
  uint16_t *end;
  uint32_t len;
  uint64_t counter_d;
  uint64_t counter_c;
  uint64_t counter_b;
  uint64_t counter_a;
  uint64_t mask_0001;
  uint64_t mask_cnts;
  uint64_t mask_bits;
  uint local_b4;
  int local_b0;
  ushort local_aa;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint64_t local_68;
  ushort *local_60;
  uint local_54;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  int *local_18;
  uint local_c;
  ushort *local_8;
  
  local_20 = 0x1249124912491249;
  local_28 = 0x3801c00e007007;
  local_30 = 0x1000100010001;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  while (3 < local_c) {
    local_38 = 0;
    local_40 = 0;
    local_48 = 0;
    local_50 = 0;
    if (local_c < 0xfff) {
      local_b4 = local_c;
    }
    else {
      local_b4 = 0xfff;
    }
    local_54 = local_b4 & 0xfffffffc;
    local_c = local_c - local_54;
    local_60 = local_8 + local_54;
    for (; local_8 != local_60; local_8 = local_8 + 4) {
      local_68 = pospopcnt_loadu_u64(local_8);
      local_70 = local_68 & 0x1249124912491249;
      local_78 = local_68 >> 1 & 0x1249124912491249;
      local_80 = local_68 >> 2 & 0x1249124912491249;
      local_88 = local_68 >> 0xf & 0x1000100010001;
      local_70 = pospopcnt_umul128(local_70,0x1000100010001,&local_90);
      local_78 = pospopcnt_umul128(local_78,0x1000100010001,&local_98);
      uVar4 = pospopcnt_umul128(local_80,0x1000100010001,&local_a0);
      local_70 = local_90 + local_70;
      local_78 = local_98 + local_78;
      local_80 = local_a0 + uVar4;
      local_38 = (local_70 & 0x3801c00e007007) + local_38;
      local_40 = (local_78 & 0x3801c00e007007) + local_40;
      local_48 = (local_80 & 0x3801c00e007007) + local_48;
      local_50 = local_88 + local_50;
    }
    *local_18 = *local_18 + ((uint)local_38 & 0xfff);
    local_18[1] = local_18[1] + ((uint)local_40 & 0xfff);
    local_18[2] = local_18[2] + ((uint)local_48 & 0xfff);
    uVar1 = (uint)(local_38 >> 0x20);
    local_18[3] = local_18[3] + (uVar1 >> 0x13);
    uVar2 = (uint)(local_40 >> 0x20);
    local_18[4] = local_18[4] + (uVar2 >> 0x13);
    uVar3 = (uint)(local_48 >> 0x20);
    local_18[5] = local_18[5] + (uVar3 >> 0x13);
    local_18[6] = local_18[6] + (uVar1 >> 6 & 0xfff);
    local_18[7] = local_18[7] + (uVar2 >> 6 & 0xfff);
    local_18[8] = local_18[8] + (uVar3 >> 6 & 0xfff);
    local_18[9] = local_18[9] + ((uint)(local_38 >> 0x19) & 0xfff);
    local_18[10] = local_18[10] + ((uint)(local_40 >> 0x19) & 0xfff);
    local_18[0xb] = local_18[0xb] + ((uint)(local_48 >> 0x19) & 0xfff);
    local_18[0xc] = local_18[0xc] + ((uint)(local_38 >> 0xc) & 0xfff);
    local_18[0xd] = local_18[0xd] + ((uint)(local_40 >> 0xc) & 0xfff);
    local_18[0xe] = local_18[0xe] + ((uint)(local_48 >> 0xc) & 0xfff);
    local_18[0xf] = local_18[0xf] + (uint)(ushort)((ulong)(local_50 * 0x1000100010001) >> 0x30);
  }
  puVar5 = local_8 + local_c;
  for (; local_8 != puVar5; local_8 = local_8 + 1) {
    local_aa = *local_8;
    for (local_b0 = 0; local_b0 != 0x10; local_b0 = local_b0 + 1) {
      local_18[local_b0] = (local_aa & 1) + local_18[local_b0];
      local_aa = (ushort)((int)(uint)local_aa >> 1);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_scalar_umul128(const uint16_t* in, uint32_t n, uint32_t* out) {
    const uint64_t mask_bits = UINT64_C(0x1249124912491249); // 00000000 00000100 01110000 00010010 10001110 10110000 01101010 11110001
    const uint64_t mask_cnts = UINT64_C(0x003801C00E007007); // 00000000 00111000 00000001 11000000 00001110 00000000 01110000 00001000
    const uint64_t mask_0001 = UINT64_C(0x0001000100010001); // 00000000 00000001 00000000 00000001 00000000 00000001 00000000 00000001

    while (n >= 4) {
        uint64_t counter_a = 0; // 5 packed 12-bit counters (4 unused bits).
        uint64_t counter_b = 0;
        uint64_t counter_c = 0;
        uint64_t counter_d = 0;

        // Terminate before overflowing the counters.
        uint32_t len = ((n < 0x0FFF) ? n : 0x0FFF) & ~3;
        n -= len;
        for (const uint16_t* end = &in[len]; in != end; in += 4) {
            uint64_t v = pospopcnt_loadu_u64(in);
            uint64_t a = v & mask_bits;         // 0b0001001001001001
            uint64_t b = (v >> 1)  & mask_bits; // 0b0010010010010010 >> 1
            uint64_t c = (v >> 2)  & mask_bits; // 0b0100100100100100 >> 2
            uint64_t d = (v >> 15) & mask_0001; // 0b1000000000000000 >> 15
            uint64_t hi_a, hi_b, hi_c;
            a = pospopcnt_umul128(a, mask_0001, &hi_a);
            b = pospopcnt_umul128(b, mask_0001, &hi_b);
            c = pospopcnt_umul128(c, mask_0001, &hi_c);
            a += hi_a; // Broadcast 3-bit counts.
            b += hi_b;
            c += hi_c;
            counter_a += a & mask_cnts;
            counter_b += b & mask_cnts;
            counter_c += c & mask_cnts;
            counter_d += d;
        }

        out[0]  += counter_a & 0x0FFF;
        out[1]  += counter_b & 0x0FFF;
        out[2]  += counter_c & 0x0FFF;
        out[3]  += (counter_a >> 51);
        out[4]  += (counter_b >> 51);
        out[5]  += (counter_c >> 51);
        out[6]  += (counter_a >> 38) & 0x0FFF;
        out[7]  += (counter_b >> 38) & 0x0FFF;
        out[8]  += (counter_c >> 38) & 0x0FFF;
        out[9]  += (counter_a >> 25) & 0x0FFF;
        out[10] += (counter_b >> 25) & 0x0FFF;
        out[11] += (counter_c >> 25) & 0x0FFF;
        out[12] += (counter_a >> 12) & 0x0FFF;
        out[13] += (counter_b >> 12) & 0x0FFF;
        out[14] += (counter_c >> 12) & 0x0FFF;
        out[15] += (counter_d * mask_0001) >> 48;
    }

    // Residual words.
    for (const uint16_t* tail_end = &in[n]; in != tail_end; ++in) {
        uint16_t x = *in;
        for (int i = 0; i != 16; ++i) {
            out[i] += x & 1;
            x >>= 1;
        }
    }

    return 0;
}